

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O3

uuid __thiscall
uuids::basic_uuid_random_generator<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>_>
::operator()(basic_uuid_random_generator<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>_>
             *this)

{
  array<unsigned_char,_16UL> aVar1;
  result_type rVar2;
  ulong uVar3;
  undefined8 local_20;
  byte local_18;
  undefined7 uStack_17;
  
  uVar3 = 0xfffffffffffffffc;
  do {
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                      (&this->distribution,
                       (this->generator).
                       super___shared_ptr<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(param_type *)this);
    *(result_type *)((long)&local_20 + uVar3 + 4) = rVar2;
    uVar3 = uVar3 + 4;
  } while (uVar3 < 0xc);
  uVar3 = CONCAT17(local_20._7_1_,CONCAT16(local_20._6_1_,(undefined6)local_20)) &
          0xff0fffffffffffff | 0x40000000000000;
  aVar1._M_elems[8] = local_18 & 0x3f | 0x80;
  aVar1._M_elems[0] = (char)uVar3;
  aVar1._M_elems[1] = (char)(uVar3 >> 8);
  aVar1._M_elems[2] = (char)(uVar3 >> 0x10);
  aVar1._M_elems[3] = (char)(uVar3 >> 0x18);
  aVar1._M_elems[4] = (char)(uVar3 >> 0x20);
  aVar1._M_elems[5] = (char)(uVar3 >> 0x28);
  aVar1._M_elems[6] = (char)(uVar3 >> 0x30);
  aVar1._M_elems[7] = (char)(uVar3 >> 0x38);
  aVar1._M_elems[9] = (undefined1)uStack_17;
  aVar1._M_elems[10] = uStack_17._1_1_;
  aVar1._M_elems[0xb] = uStack_17._2_1_;
  aVar1._M_elems[0xc] = uStack_17._3_1_;
  aVar1._M_elems[0xd] = uStack_17._4_1_;
  aVar1._M_elems[0xe] = uStack_17._5_1_;
  aVar1._M_elems[0xf] = uStack_17._6_1_;
  return (array<unsigned_char,_16UL>)(array<unsigned_char,_16UL>)aVar1._M_elems;
}

Assistant:

[[nodiscard]] uuid operator()()
      {
         alignas(uint32_t) uint8_t bytes[16];
         for (int i = 0; i < 16; i += 4)
            *reinterpret_cast<uint32_t*>(bytes + i) = distribution(*generator);

         // variant must be 10xxxxxx
         bytes[8] &= 0xBF;
         bytes[8] |= 0x80;

         // version must be 0100xxxx
         bytes[6] &= 0x4F;
         bytes[6] |= 0x40;

         return uuid{std::begin(bytes), std::end(bytes)};
      }